

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall cmParsePHPCoverage::ReadFileInformation(cmParsePHPCoverage *this,istream *in)

{
  ulong __n;
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> __s;
  long *plVar5;
  bool bVar6;
  cmParsePHPCoverage *this_00;
  long lVar7;
  char c;
  __array s;
  char buf [4];
  string fileName;
  char *local_1d0 [4];
  int local_1ac;
  ostringstream cmCTestLog_msg;
  
  this_00 = (cmParsePHPCoverage *)buf;
  std::istream::read((char *)in,(long)this_00);
  buf[2] = '\0';
  iVar3 = bcmp(this_00,"s:",3);
  if (iVar3 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"failed to read start of file info found: ["
                            );
    poVar4 = std::operator<<(poVar4,buf);
    std::operator<<(poVar4,"]\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x8c,fileName._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&fileName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    return false;
  }
  local_1ac = 0;
  ReadInt(this_00,in,&local_1ac);
  lVar7 = (long)local_1ac;
  __n = lVar7 + 2;
  __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(__n);
  memset((void *)__s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl,0,__n);
  s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 __s.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  plVar5 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) && (c != '\"')) {
    bVar6 = false;
    goto LAB_0023ef52;
  }
  std::istream::read((char *)in,
                     (long)s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl);
  *(undefined1 *)
   ((long)s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl + lVar7) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fileName,
             (char *)s._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (allocator<char> *)&cmCTestLog_msg);
  plVar5 = (long *)std::istream::get((char *)in);
  if (((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) && (c != '\"')) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"failed to read close quote\n");
    poVar4 = std::operator<<(poVar4,"read [");
    poVar4 = std::operator<<(poVar4,c);
    std::operator<<(poVar4,"]\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0xa0,local_1d0[0],false);
LAB_0023ef32:
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar6 = false;
  }
  else {
    bVar2 = ReadCoverageArray(this,in,&fileName);
    bVar6 = true;
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"failed to read coverage array for file: "
                              );
      poVar4 = std::operator<<(poVar4,(string *)&fileName);
      std::operator<<(poVar4,"\n");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                   ,0xa6,local_1d0[0],false);
      goto LAB_0023ef32;
    }
  }
  std::__cxx11::string::~string((string *)&fileName);
LAB_0023ef52:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&s);
  return bVar6;
}

Assistant:

bool cmParsePHPCoverage::ReadFileInformation(std::istream& in)
{
  char buf[4];
  in.read(buf, 2);
  buf[2] = 0;
  if (strcmp(buf, "s:") != 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of file info found: [" << buf << "]\n");
    return false;
  }
  char c;
  int size = 0;
  if (this->ReadInt(in, size)) {
    size++; // add one for null termination
    auto s = cm::make_unique<char[]>(size + 1);
    // read open quote
    if (in.get(c) && c != '"') {
      return false;
    }
    // read the string data
    in.read(s.get(), size - 1);
    s[size - 1] = 0;
    std::string fileName = s.get();
    // read close quote
    if (in.get(c) && c != '"') {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read close quote\n"
                   << "read [" << c << "]\n");
      return false;
    }
    if (!this->ReadCoverageArray(in, fileName)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "failed to read coverage array for file: " << fileName
                                                            << "\n");
      return false;
    }
    return true;
  }
  return false;
}